

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O0

string * __thiscall
duckdb::SQLLogicTestRunner::ReplaceLoopIterator
          (SQLLogicTestRunner *this,string *text,string *loop_iterator_name,string *replacement)

{
  StringRef capturedExpression;
  byte bVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  string *in_R8;
  idx_t i;
  AssertionHandler catchAssertionHandler;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  replacement_splits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  name_splits;
  reference in_stack_fffffffffffffc08;
  AssertionHandler *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  AssertionHandler *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  size_type in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffc58;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  string local_1c8 [48];
  StringRef local_198;
  SourceLineInfo local_188;
  StringRef local_178;
  string *in_stack_fffffffffffffee0;
  SQLLogicTestRunner *in_stack_fffffffffffffee8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_d9 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  allocator local_99;
  string local_98 [48];
  string local_68 [32];
  string local_48 [72];
  
  std::__cxx11::string::string(local_68,in_R8);
  ReplaceKeywords(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::operator=(in_R8,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,",",&local_99);
  bVar1 = duckdb::StringUtil::Contains(in_RCX,local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_318,in_RDX);
    std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffc58),in_stack_fffffffffffffc50);
    std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
    duckdb::StringUtil::Replace(in_RDI,local_318,local_338,in_R8);
    std::__cxx11::string::~string(local_338);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_318);
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_d9 + 1),",",(allocator *)__rhs);
    duckdb::StringUtil::Split((string *)&local_b8,in_RCX);
    std::__cxx11::string::~string((string *)(local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffee8,",",(allocator *)&stack0xfffffffffffffee7);
    duckdb::StringUtil::Split((string *)&local_f8,in_R8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
    sVar2 = Catch::clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_b8);
    sVar3 = Catch::clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_f8);
    if (sVar2 != sVar3) {
      local_178 = operator____catch_sr
                            ((char *)in_stack_fffffffffffffc10,(size_t)in_stack_fffffffffffffc08);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_188,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sqlite/sqllogic_test_runner.cpp"
                 ,0x93);
      local_198.m_start = (char *)0x0;
      local_198.m_size = 0;
      Catch::StringRef::StringRef(&local_198);
      capturedExpression.m_size = in_stack_fffffffffffffc30;
      capturedExpression.m_start = in_stack_fffffffffffffc28;
      Catch::AssertionHandler::AssertionHandler
                (in_stack_fffffffffffffc20,(StringRef *)in_stack_fffffffffffffc18,
                 (SourceLineInfo *)in_stack_fffffffffffffc10,capturedExpression,
                 (Flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1d8 = 0;
      Catch::MessageStream::MessageStream((MessageStream *)0x7c8d1c);
      std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffc58),__rhs);
      std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
      std::operator+(in_stack_fffffffffffffc18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc10);
      std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
      Catch::operator+(local_208);
      Catch::MessageStream::operator<<
                ((MessageStream *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      Catch::ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffc08)
      ;
      Catch::StringRef::StringRef((StringRef *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      Catch::AssertionHandler::handleMessage
                (in_stack_fffffffffffffc10,(OfType)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                 (StringRef *)0x7c8e03);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      Catch::MessageStream::~MessageStream((MessageStream *)0x7c8e53);
      Catch::AssertionHandler::complete(in_stack_fffffffffffffc10);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc10);
    }
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while( true ) {
      __lhs = local_278;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Catch::clara::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_b8);
      if (pbVar4 <= __lhs) break;
      std::__cxx11::string::string(local_2b8,in_RDX);
      in_stack_fffffffffffffc10 =
           (AssertionHandler *)
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
      std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffc58),__rhs);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffc10);
      in_stack_fffffffffffffc08 =
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)in_stack_fffffffffffffc10,(size_type)in_stack_fffffffffffffc08);
      duckdb::StringUtil::Replace(local_298,local_2b8,local_2d8,in_stack_fffffffffffffc08);
      std::__cxx11::string::operator=(in_RDX,local_298);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_2d8);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_2b8);
      local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_278->field_0x1;
    }
    std::__cxx11::string::string((string *)in_RDI,in_RDX);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x7c9256);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x7c9263);
  }
  return in_RDI;
}

Assistant:

string SQLLogicTestRunner::ReplaceLoopIterator(string text, string loop_iterator_name, string replacement) {
	replacement = ReplaceKeywords(replacement);
	if (StringUtil::Contains(loop_iterator_name, ",")) {
		auto name_splits = StringUtil::Split(loop_iterator_name, ",");
		auto replacement_splits = StringUtil::Split(replacement, ",");
		if (name_splits.size() != replacement_splits.size()) {
			FAIL("foreach loop: number of commas in loop iterator (" + loop_iterator_name +
			     ") does not match number of commas in replacement (" + replacement + ")");
		}
		for (idx_t i = 0; i < name_splits.size(); i++) {
			text = StringUtil::Replace(text, "${" + name_splits[i] + "}", replacement_splits[i]);
		}
		return text;
	} else {
		return StringUtil::Replace(text, "${" + loop_iterator_name + "}", replacement);
	}
}